

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  long lVar2;
  int *piVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  cmGraphEdge *oi;
  int *piVar7;
  uint *puVar8;
  
  fwrite("The strongly connected components are:\n",0x27,1,_stderr);
  pcVar1 = (this->CCG)._M_t.
           super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
           .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  if (*(pointer *)
       ((long)&(pcVar1->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> + 8) !=
      *(pointer *)
       &(pcVar1->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
        _M_impl) {
    uVar6 = 0;
    do {
      fprintf(_stderr,"Component (%u):\n",uVar6);
      lVar2 = *(long *)&(pcVar1->Components).
                        super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                        _M_impl;
      piVar3 = *(int **)(lVar2 + 8 + uVar6 * 0x18);
      for (piVar7 = *(int **)(lVar2 + uVar6 * 0x18); piVar7 != piVar3; piVar7 = piVar7 + 1) {
        fprintf(_stderr,"  item %d [%s]\n",(long)*piVar7,
                (pointer)(this->EntryList).
                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar7].Item.Value._M_dataplus);
      }
      lVar2 = *(long *)&(((this->CCG)._M_t.
                          super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                          .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                        ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
      lVar5 = (long)(int)uVar6 * 0x18;
      puVar4 = *(uint **)(lVar2 + 8 + lVar5);
      for (puVar8 = *(uint **)(lVar2 + lVar5); puVar8 != puVar4; puVar8 = puVar8 + 6) {
        fprintf(_stderr,"  followed by Component (%d)\n",(ulong)*puVar8);
      }
      fprintf(_stderr,"  topo order index %d\n",
              (ulong)(uint)(this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar6]);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)(((long)*(pointer *)
                                     ((long)&(pcVar1->Components).
                                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                     + 8) -
                             *(long *)&(pcVar1->Components).
                                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                       ._M_impl) / 0x18));
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for (unsigned int c = 0; c < components.size(); ++c) {
    fprintf(stderr, "Component (%u):\n", c);
    NodeList const& nl = components[c];
    for (int i : nl) {
      fprintf(stderr, "  item %d [%s]\n", i,
              this->EntryList[i].Item.Value.c_str());
    }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for (cmGraphEdge const& oi : ol) {
      int i = oi;
      fprintf(stderr, "  followed by Component (%d)\n", i);
    }
    fprintf(stderr, "  topo order index %d\n", this->ComponentOrder[c]);
  }
  fprintf(stderr, "\n");
}